

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

descriptor_state * __thiscall
asio::detail::object_pool<asio::detail::epoll_reactor::descriptor_state>::alloc<bool>
          (object_pool<asio::detail::epoll_reactor::descriptor_state> *this,bool arg)

{
  descriptor_state *pdVar1;
  descriptor_state **ppdVar2;
  descriptor_state *local_20;
  descriptor_state *o;
  bool arg_local;
  object_pool<asio::detail::epoll_reactor::descriptor_state> *this_local;
  
  local_20 = this->free_list_;
  if (local_20 == (descriptor_state *)0x0) {
    local_20 = object_pool_access::create<asio::detail::epoll_reactor::descriptor_state,bool>(arg);
  }
  else {
    ppdVar2 = object_pool_access::next<asio::detail::epoll_reactor::descriptor_state>
                        (this->free_list_);
    this->free_list_ = *ppdVar2;
  }
  pdVar1 = this->live_list_;
  ppdVar2 = object_pool_access::next<asio::detail::epoll_reactor::descriptor_state>(local_20);
  *ppdVar2 = pdVar1;
  ppdVar2 = object_pool_access::prev<asio::detail::epoll_reactor::descriptor_state>(local_20);
  *ppdVar2 = (descriptor_state *)0x0;
  if (this->live_list_ != (descriptor_state *)0x0) {
    ppdVar2 = object_pool_access::prev<asio::detail::epoll_reactor::descriptor_state>
                        (this->live_list_);
    *ppdVar2 = local_20;
  }
  this->live_list_ = local_20;
  return local_20;
}

Assistant:

Object* alloc(Arg arg)
  {
    Object* o = free_list_;
    if (o)
      free_list_ = object_pool_access::next(free_list_);
    else
      o = object_pool_access::create<Object>(arg);

    object_pool_access::next(o) = live_list_;
    object_pool_access::prev(o) = 0;
    if (live_list_)
      object_pool_access::prev(live_list_) = o;
    live_list_ = o;

    return o;
  }